

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_options.h
# Opt level: O2

void __thiscall google::protobuf::compiler::java::Options::~Options(Options *this)

{
  std::__cxx11::string::~string((string *)&this->output_list_file);
  std::__cxx11::string::~string((string *)&this->annotation_list_file);
  return;
}

Assistant:

Options()
      : generate_immutable_code(false),
        generate_mutable_code(false),
        generate_shared_code(false),
        enforce_lite(false),
        annotate_code(false) {
  }